

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O3

double __thiscall Matrix<double,_3,_1>::norm(Matrix<double,_3,_1> *this)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  int i;
  int row;
  int iVar4;
  double dVar5;
  
  iVar4 = this->rows;
  dVar5 = -1.0;
  if (0 < iVar4) {
    iVar2 = this->cols;
    if (0 < iVar2) {
      dVar5 = 0.0;
      row = 0;
      do {
        if (0 < iVar2) {
          iVar4 = 0;
          do {
            pdVar3 = operator()(this,row,iVar4);
            dVar1 = *pdVar3;
            pdVar3 = operator()(this,row,iVar4);
            dVar5 = dVar5 + dVar1 * *pdVar3;
            iVar4 = iVar4 + 1;
            iVar2 = this->cols;
          } while (iVar4 < iVar2);
          iVar4 = this->rows;
        }
        row = row + 1;
      } while (row < iVar4);
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
        return dVar5;
      }
      dVar5 = SQRT(dVar5);
    }
  }
  return dVar5;
}

Assistant:

double Matrix<T, _0, _1>::norm()
{
    if(this->rows <= 0 || this->cols <= 0)
        return -1;
    double sum = 0;
    for(int i = 0; i < rows; ++i)
        for(int j = 0; j < cols; ++j)
            sum += this->operator()(i, j) * this->operator()(i, j);
    return sqrt(sum);
}